

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_fetch.hpp
# Opt level: O0

void duckdb::AlpFetchRow<double>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  bool bVar1;
  AlpScanState<double> *this;
  long in_RDX;
  AlpVectorState<double> *in_RDI;
  long in_R8;
  unsigned_long *result_data;
  AlpScanState<double> scan_state;
  uint8_t *dest;
  AlpScanState<double> *value_buffer;
  AlpScanState<double> *in_stack_ffffffffffff9760;
  ColumnSegment *in_stack_ffffffffffff9768;
  SegmentScanState in_stack_ffffffffffff9770;
  ColumnSegment *in_stack_ffffffffffff9798;
  AlpScanState<double> *in_stack_ffffffffffff97a0;
  AlpScanState<double> *local_30;
  
  dest = &stack0xffffffffffff9770;
  AlpScanState<double>::AlpScanState(in_stack_ffffffffffff97a0,in_stack_ffffffffffff9798);
  UnsafeNumericCast<unsigned_long,long,void>(in_RDX);
  AlpScanState<double>::Skip
            ((AlpScanState<double> *)in_stack_ffffffffffff9770._vptr_SegmentScanState,
             in_stack_ffffffffffff9768,(idx_t)in_stack_ffffffffffff9760);
  this = (AlpScanState<double> *)FlatVector::GetData<unsigned_long>((Vector *)0x9ef751);
  (this->vector_state).decoded_values[in_R8 + -8] = 0.0;
  value_buffer = this;
  bVar1 = AlpScanState<double>::VectorFinished((AlpScanState<double> *)&stack0xffffffffffff9770);
  if ((bVar1) && (in_stack_ffffffffffff97a0 < local_30)) {
    AlpScanState<double>::LoadVector<false>(in_stack_ffffffffffff9760,(double *)value_buffer);
  }
  AlpVectorState<double>::Scan<false>(in_RDI,dest,(idx_t)this);
  AlpScanState<double>::~AlpScanState(this);
  return;
}

Assistant:

void AlpFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	using EXACT_TYPE = typename FloatingToExact<T>::TYPE;

	AlpScanState<T> scan_state(segment);
	scan_state.Skip(segment, UnsafeNumericCast<idx_t>(row_id));
	auto result_data = FlatVector::GetData<EXACT_TYPE>(result);
	result_data[result_idx] = (EXACT_TYPE)0;

	if (scan_state.VectorFinished() && scan_state.total_value_count < scan_state.count) {
		scan_state.LoadVector(scan_state.vector_state.decoded_values);
	}
	scan_state.vector_state.Scan((uint8_t *)(result_data + result_idx), 1);
	scan_state.total_value_count++;
}